

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_opt.c
# Opt level: O0

int tnt_opt_set(tnt_opt *opt,tnt_opt_type name,__va_list_tag *args)

{
  uint uVar1;
  __time_t *p_Var2;
  int iVar3;
  char *pcVar4;
  int *local_140;
  undefined8 *local_128;
  undefined8 *local_110;
  int *local_f8;
  undefined8 *local_e0;
  undefined8 *local_c8;
  undefined8 *local_b0;
  long *local_98;
  long *local_80;
  long *local_68;
  undefined8 *local_50;
  timeval *tvp;
  __va_list_tag *args_local;
  tnt_opt_type name_local;
  tnt_opt *opt_local;
  
  switch(name) {
  case TNT_OPT_URI:
    if (opt->uristr != (char *)0x0) {
      tnt_mem_free(opt->uristr);
    }
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_50 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_50 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_50 + 1;
    }
    pcVar4 = tnt_mem_dup((char *)*local_50);
    opt->uristr = pcVar4;
    if (opt->uristr == (char *)0x0) {
      return 2;
    }
    iVar3 = uri_parse(opt->uri,opt->uristr);
    if (iVar3 == -1) {
      return 1;
    }
    break;
  case TNT_OPT_TMOUT_CONNECT:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_68 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_68 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = local_68 + 1;
    }
    p_Var2 = (__time_t *)*local_68;
    (opt->tmout_connect).tv_sec = *p_Var2;
    (opt->tmout_connect).tv_usec = p_Var2[1];
    break;
  case TNT_OPT_TMOUT_RECV:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_80 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_80 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = local_80 + 1;
    }
    p_Var2 = (__time_t *)*local_80;
    (opt->tmout_recv).tv_sec = *p_Var2;
    (opt->tmout_recv).tv_usec = p_Var2[1];
    break;
  case TNT_OPT_TMOUT_SEND:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_98 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_98 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = local_98 + 1;
    }
    p_Var2 = (__time_t *)*local_98;
    (opt->tmout_send).tv_sec = *p_Var2;
    (opt->tmout_send).tv_usec = p_Var2[1];
    break;
  case TNT_OPT_SEND_CB:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_b0 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_b0 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_b0 + 1;
    }
    opt->send_cb = (void *)*local_b0;
    break;
  case TNT_OPT_SEND_CBV:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_c8 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_c8 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_c8 + 1;
    }
    opt->send_cbv = (void *)*local_c8;
    break;
  case TNT_OPT_SEND_CB_ARG:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_e0 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_e0 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_e0 + 1;
    }
    opt->send_cb_arg = (void *)*local_e0;
    break;
  case TNT_OPT_SEND_BUF:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_f8 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_f8 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_f8 + 2;
    }
    opt->send_buf = *local_f8;
    break;
  case TNT_OPT_RECV_CB:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_110 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_110 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_110 + 1;
    }
    opt->recv_cb = (void *)*local_110;
    break;
  case TNT_OPT_RECV_CB_ARG:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_128 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_128 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_128 + 1;
    }
    opt->recv_cb_arg = (void *)*local_128;
    break;
  case TNT_OPT_RECV_BUF:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_140 = (int *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_140 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = local_140 + 2;
    }
    opt->recv_buf = *local_140;
    break;
  default:
    return 1;
  }
  return 0;
}

Assistant:

int
tnt_opt_set(struct tnt_opt *opt, enum tnt_opt_type name, va_list args)
{
	struct timeval *tvp;
	switch (name) {
	case TNT_OPT_URI:
		if (opt->uristr) tnt_mem_free((void *)opt->uristr);
		opt->uristr = tnt_mem_dup(va_arg(args, char*));
		if (opt->uristr == NULL)
			return TNT_EMEMORY;
		if (uri_parse(opt->uri, opt->uristr) == -1)
			return TNT_EFAIL;
		break;
	case TNT_OPT_TMOUT_CONNECT:
		tvp = va_arg(args, struct timeval*);
		memcpy(&opt->tmout_connect, tvp, sizeof(struct timeval));
		break;
	case TNT_OPT_TMOUT_RECV:
		tvp = va_arg(args, struct timeval*);
		memcpy(&opt->tmout_recv, tvp, sizeof(struct timeval));
		break;
	case TNT_OPT_TMOUT_SEND:
		tvp = va_arg(args, struct timeval*);
		memcpy(&opt->tmout_send, tvp, sizeof(struct timeval));
		break;
	case TNT_OPT_SEND_CB:
		opt->send_cb = va_arg(args, void*);
		break;
	case TNT_OPT_SEND_CBV:
		opt->send_cbv = va_arg(args, void*);
		break;
	case TNT_OPT_SEND_CB_ARG:
		opt->send_cb_arg = va_arg(args, void*);
		break;
	case TNT_OPT_SEND_BUF:
		opt->send_buf = va_arg(args, int);
		break;
	case TNT_OPT_RECV_CB:
		opt->recv_cb = va_arg(args, void*);
		break;
	case TNT_OPT_RECV_CB_ARG:
		opt->recv_cb_arg = va_arg(args, void*);
		break;
	case TNT_OPT_RECV_BUF:
		opt->recv_buf = va_arg(args, int);
		break;
	default:
		return TNT_EFAIL;
	}
	return TNT_EOK;
}